

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O2

int __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_true>::TryParseExtendedUnicodeEscape
          (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this,Char *c,
          bool *previousSurrogatePart,bool trackSurrogatePair)

{
  StandardChars<char16_t> *pSVar1;
  code *pcVar2;
  bool bVar3;
  EncodedChar EVar4;
  Char CVar5;
  uint codePoint;
  uint uVar6;
  EncodedChar *pEVar7;
  undefined4 *puVar8;
  EncodedChar *pEVar9;
  uint n;
  uint32 consumptionLength;
  CharCount n_00;
  char16 local_32 [4];
  char16 other;
  
  if (((((this->scriptContext->config).threadConfig)->m_ES6Unicode == true) &&
      (this->next + 2 <= this->inputLim)) && (EVar4 = ECLookahead(this,0), EVar4 == L'{')) {
    pSVar1 = this->standardEncodedChars;
    EVar4 = ECLookahead(this,1);
    bVar3 = StandardChars<char16_t>::IsHex(pSVar1,EVar4);
    if (bVar3) {
      pSVar1 = this->standardEncodedChars;
      EVar4 = ECLookahead(this,1);
      codePoint = StandardChars<char16_t>::DigitValue(pSVar1,EVar4);
      consumptionLength = 4;
      do {
        n_00 = consumptionLength - 2;
        n = consumptionLength - 1;
        pEVar7 = this->inputLim;
        pEVar9 = this->next;
        if (pEVar7 < pEVar9 + n) {
LAB_00d21e8b:
          if (pEVar7 < pEVar9 + n) {
            return 0;
          }
          EVar4 = ECLookahead(this,n_00);
          if (EVar4 != L'}') {
            return 0;
          }
          if (n < 3) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar8 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0x111,"(consumptionNumber >= 3)","consumptionNumber >= 3");
            if (!bVar3) goto LAB_00d2202f;
            *puVar8 = 0;
          }
          if (((trackSurrogatePair) && (*previousSurrogatePart == false)) &&
             (((this->scriptContext->config).threadConfig)->m_ES6Unicode == true)) {
            TrackIfSurrogatePair(this,codePoint,this->next + -1,consumptionLength);
          }
          if (codePoint < 0x10000) {
            CVar5 = Chars<char16_t>::UTC(codePoint);
            *c = CVar5;
          }
          else {
            if (*previousSurrogatePart != true) {
              *previousSurrogatePart = true;
              Js::NumberUtilities::CodePointAsSurrogatePair(codePoint,c,local_32);
              EVar4 = ECLookback(this,1);
              if ((EVar4 != L'u') || (EVar4 = ECLookback(this,2), EVar4 != L'\\')) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
                *puVar8 = 1;
                bVar3 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                   ,300,"(ECLookback(1) == \'u\' && ECLookback(2) == \'\\\\\')",
                                   "ECLookback(1) == \'u\' && ECLookback(2) == \'\\\\\'");
                if (!bVar3) {
LAB_00d2202f:
                  pcVar2 = (code *)invalidInstructionException();
                  (*pcVar2)();
                }
                *puVar8 = 0;
              }
              ECRevert(this,2);
              return n;
            }
            *previousSurrogatePart = false;
            Js::NumberUtilities::CodePointAsSurrogatePair(codePoint,local_32,c);
          }
          ECConsumeMultiUnit(this,n);
          return n;
        }
        pSVar1 = this->standardEncodedChars;
        EVar4 = ECLookahead(this,n_00);
        bVar3 = StandardChars<char16_t>::IsHex(pSVar1,EVar4);
        if (!bVar3) {
          pEVar7 = this->inputLim;
          pEVar9 = this->next;
          goto LAB_00d21e8b;
        }
        pSVar1 = this->standardEncodedChars;
        EVar4 = ECLookahead(this,n_00);
        uVar6 = StandardChars<char16_t>::DigitValue(pSVar1,EVar4);
        codePoint = codePoint * 0x10 + uVar6;
        consumptionLength = consumptionLength + 1;
      } while (codePoint < 0x110000);
      DeferredFailIfUnicode(this,-0x7ff5e9d6);
    }
  }
  return 0;
}

Assistant:

int Parser<P, IsLiteral>::TryParseExtendedUnicodeEscape(Char& c, bool& previousSurrogatePart, bool trackSurrogatePair /* = false */)
    {
        if (!scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
        {
            return 0;
        }

        if (!ECCanConsume(2) || ECLookahead(0) !='{' || !standardEncodedChars->IsHex(ECLookahead(1)))
        {
            return 0;
        }

        // The first character is mandatory to consume escape sequence, so we check for it above, at this stage we can set it as we already checked.
        codepoint_t codePoint = standardEncodedChars->DigitValue(ECLookahead(1));

        int i = 2;

        while(ECCanConsume(i + 1) && standardEncodedChars->IsHex(ECLookahead(i)))
        {
            codePoint <<= 4;
            codePoint += standardEncodedChars->DigitValue(ECLookahead(i));

            if (codePoint > 0x10FFFF)
            {
                DeferredFailIfUnicode(JSERR_RegExpInvalidEscape);
                return 0;
            }
            i++;
        }

        if(!ECCanConsume(i + 1) || ECLookahead(i) != '}')
        {
            return 0;
        }

        uint consumptionNumber = i + 1;
        Assert(consumptionNumber >= 3);

        if (!previousSurrogatePart && trackSurrogatePair && this->scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
        {
            // Current location
            TrackIfSurrogatePair(codePoint, (next - 1), consumptionNumber + 1);
        }

        char16 other;
        // Generally if this code point is a single character, then we take it and return.
        // If the character is made up of two characters then we emit the first and backtrack to the start of th escape sequence;
        // Following that we check if we have already seen the first character, and if so emit the second and consume the entire escape sequence.
        if (codePoint < 0x10000)
        {
            c = UTC(codePoint);
            ECConsumeMultiUnit(consumptionNumber);
        }
        else if (previousSurrogatePart)
        {
            previousSurrogatePart = false;
            Js::NumberUtilities::CodePointAsSurrogatePair(codePoint, &other, &c);
            ECConsumeMultiUnit(consumptionNumber);
        }
        else
        {
            previousSurrogatePart = true;
            Js::NumberUtilities::CodePointAsSurrogatePair(codePoint, &c, &other);
            Assert(ECLookback(1) == 'u' && ECLookback(2) == '\\');
            ECRevert(2);
        }

        return consumptionNumber;
    }